

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O0

void __thiscall icu_63::NFRuleSet::appendRules(NFRuleSet *this,UnicodeString *result)

{
  uint32_t uVar1;
  NFRule *pNVar2;
  int64_t iVar3;
  NFRule *this_00;
  int64_t iVar4;
  NFRule *fractionRule;
  uint32_t fIdx;
  NFRule *rule;
  uint32_t i;
  UnicodeString *result_local;
  NFRuleSet *this_local;
  
  UnicodeString::append(result,&this->name);
  UnicodeString::append(result,L':');
  UnicodeString::append(result,L'\n');
  for (rule._4_4_ = 0; uVar1 = NFRuleList::size(&this->rules), rule._4_4_ < uVar1;
      rule._4_4_ = rule._4_4_ + 1) {
    pNVar2 = NFRuleList::operator[](&this->rules,rule._4_4_);
    NFRule::_appendRuleText(pNVar2,result);
    UnicodeString::append(result,L'\n');
  }
  for (rule._4_4_ = 0; rule._4_4_ < 6; rule._4_4_ = rule._4_4_ + 1) {
    pNVar2 = this->nonNumericalRules[rule._4_4_];
    if (this->nonNumericalRules[rule._4_4_] != (NFRule *)0x0) {
      iVar3 = NFRule::getBaseValue(pNVar2);
      if (((iVar3 == -2) || (iVar3 = NFRule::getBaseValue(pNVar2), iVar3 == -3)) ||
         (iVar3 = NFRule::getBaseValue(pNVar2), iVar3 == -4)) {
        for (fractionRule._4_4_ = 0; uVar1 = NFRuleList::size(&this->fractionRules),
            fractionRule._4_4_ < uVar1; fractionRule._4_4_ = fractionRule._4_4_ + 1) {
          this_00 = NFRuleList::operator[](&this->fractionRules,fractionRule._4_4_);
          iVar3 = NFRule::getBaseValue(this_00);
          iVar4 = NFRule::getBaseValue(pNVar2);
          if (iVar3 == iVar4) {
            NFRule::_appendRuleText(this_00,result);
            UnicodeString::append(result,L'\n');
          }
        }
      }
      else {
        NFRule::_appendRuleText(pNVar2,result);
        UnicodeString::append(result,L'\n');
      }
    }
  }
  return;
}

Assistant:

void
NFRuleSet::appendRules(UnicodeString& result) const
{
    uint32_t i;

    // the rule set name goes first...
    result.append(name);
    result.append(gColon);
    result.append(gLineFeed);

    // followed by the regular rules...
    for (i = 0; i < rules.size(); i++) {
        rules[i]->_appendRuleText(result);
        result.append(gLineFeed);
    }

    // followed by the special rules (if they exist)
    for (i = 0; i < NON_NUMERICAL_RULE_LENGTH; ++i) {
        NFRule *rule = nonNumericalRules[i];
        if (nonNumericalRules[i]) {
            if (rule->getBaseValue() == NFRule::kImproperFractionRule
                || rule->getBaseValue() == NFRule::kProperFractionRule
                || rule->getBaseValue() == NFRule::kMasterRule)
            {
                for (uint32_t fIdx = 0; fIdx < fractionRules.size(); fIdx++) {
                    NFRule *fractionRule = fractionRules[fIdx];
                    if (fractionRule->getBaseValue() == rule->getBaseValue()) {
                        fractionRule->_appendRuleText(result);
                        result.append(gLineFeed);
                    }
                }
            }
            else {
                rule->_appendRuleText(result);
                result.append(gLineFeed);
            }
        }
    }
}